

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Itemset.cc
# Opt level: O2

int __thiscall Itemset::compare(Itemset *this,Itemset *ar2)

{
  Array *this_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = ((this->theItemset).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->theSize
  ;
  uVar4 = ((ar2->theItemset).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->theSize;
  if ((int)uVar3 < (int)uVar4) {
    uVar4 = uVar3;
  }
  uVar3 = 0;
  if ((int)uVar4 < 1) {
    uVar4 = 0;
  }
  while( true ) {
    this_00 = (this->theItemset).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (uVar4 == uVar3) {
      iVar1 = ((ar2->theItemset).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              theSize;
      iVar2 = this_00->theSize;
      if (iVar1 <= iVar2) {
        return (uint)(iVar1 < iVar2);
      }
      return -1;
    }
    iVar1 = Array::operator[](this_00,uVar3);
    iVar2 = Array::operator[]((ar2->theItemset).
                              super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr,uVar3);
    if (iVar2 < iVar1) break;
    iVar1 = Array::operator[]((this->theItemset).
                              super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr,uVar3);
    iVar2 = Array::operator[]((ar2->theItemset).
                              super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr,uVar3);
    uVar3 = uVar3 + 1;
    if (iVar1 < iVar2) {
      return -1;
    }
  }
  return 1;
}

Assistant:

int Itemset::compare(Itemset &ar2) {
    int len;
    if (size() <= ar2.size()) len = size();
    else len = ar2.size();
    for (int i = 0; i < len; i++) {
        if ((*theItemset)[i] > (*ar2.theItemset)[i]) return 1;
        else if ((*theItemset)[i] < (*ar2.theItemset)[i]) return -1;
    }
    if (size() < ar2.size()) return -1;
    else if (size() > ar2.size()) return 1;
    else return 0;
}